

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O1

void __thiscall
Memory::ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>::Clear
          (ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::ValidThreadAccess((this->super_ArenaData).pageAllocator);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xcf,"(this->pageAllocator->ValidThreadAccess())",
                       "Arena allocation should only be used by a single thread");
    if (!bVar2) goto LAB_006a375e;
    *puVar3 = 0;
  }
  if ((this->super_ArenaData).lockBlockList == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xd0,"(!lockBlockList)","!lockBlockList");
    if (!bVar2) {
LAB_006a375e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ArenaMemoryTracking::ReportFreeAll(&this->super_Allocator);
  StandAloneFreeListPolicy::Reset(this->freeList);
  this->freeListSize = 0;
  this->freeList = (void *)0x0;
  ReleasePageMemory(this);
  ReleaseHeapMemory(this);
  (this->super_ArenaData).cacheBlockCurrent = (char *)0x0;
  (this->cacheBlockEnd).ptr = (Type)0x3;
  this->largestHole = 0;
  this->blockState = 0;
  (this->super_ArenaData).bigBlocks = (BigBlock *)0x0;
  (this->super_ArenaData).fullBlocks = (BigBlock *)0x0;
  (this->super_ArenaData).mallocBlocks = (ArenaMemoryBlock *)0x0;
  return;
}

Assistant:

void Clear()
    {
        ASSERT_THREAD();
        Assert(!lockBlockList);
        ArenaMemoryTracking::ReportFreeAll(this);

        freeList = TFreeListPolicy::Reset(freeList);
#ifdef ARENA_ALLOCATOR_FREE_LIST_SIZE
        this->freeListSize = 0;
#endif
        ReleaseMemory();
        this->cacheBlockCurrent = nullptr;
        this->cacheBlockEnd = nullptr;
        this->bigBlocks = nullptr;
        this->fullBlocks = nullptr;
        this->largestHole = 0;
        this->mallocBlocks = nullptr;
        this->blockState = 0;
    }